

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::anon_unknown_12::anon_unknown_0::sgetarr<long_long>
               (Table *table,string *name,vector<long_long,_std::allocator<long_long>_> *ptr,
               int start_ix,int num_val,int occurrence)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = squeryarr<long_long>(table,name,ptr,start_ix,num_val,occurrence);
  if (bVar1) {
    return;
  }
  poVar2 = ErrorStream();
  std::operator<<(poVar2,"ParmParse::sgetarr ");
  if (-1 < occurrence) {
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"occurrence number ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
    std::operator<<(poVar2," of ");
  }
  poVar2 = ErrorStream();
  poVar2 = std::operator<<(poVar2,"ParmParse::sgetarr(): ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2," not found in table");
  std::operator<<(poVar2,'\n');
  poVar2 = ErrorStream();
  ParmParse::dumpTable(poVar2,false);
  Abort_host((char *)0x0);
  return;
}

Assistant:

void
sgetarr (const ParmParse::Table& table,
         const std::string&  name,
         std::vector<T>&           ptr,
         int          start_ix,
         int          num_val,
         int          occurrence)
{
    if ( squeryarr(table,name,ptr,start_ix,num_val,occurrence) == 0 )
    {
        amrex::ErrorStream() << "ParmParse::sgetarr ";
        if ( occurrence >= 0 )
        {
            amrex::ErrorStream() << "occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << "ParmParse::sgetarr(): "
                  << name
                  << " not found in table"
                  << '\n';
        ParmParse::dumpTable(amrex::ErrorStream());
        amrex::Abort();
    }
}